

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

void __thiscall QCborContainerPrivate::~QCborContainerPrivate(QCborContainerPrivate *this)

{
  QList<QtCbor::Element> *this_00;
  iterator iVar1;
  iterator iVar2;
  Element *e;
  
  this_00 = &this->elements;
  iVar1 = QList<QtCbor::Element>::begin(this_00);
  iVar2 = QList<QtCbor::Element>::end(this_00);
  for (; iVar1.i != iVar2.i; iVar1.i = iVar1.i + 1) {
    if ((((iVar1.i)->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
      deref(((iVar1.i)->field_0).container);
    }
  }
  QArrayDataPointer<QtCbor::Element>::~QArrayDataPointer(&this_00->d);
  QArrayDataPointer<char>::~QArrayDataPointer(&(this->data).d);
  return;
}

Assistant:

QCborContainerPrivate::~QCborContainerPrivate()
{
    // delete our elements
    for (Element &e : elements) {
        if (e.flags & Element::IsContainer)
            e.container->deref();
    }
}